

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O1

void __thiscall Expr::GenEval(Expr *this,Output *out_cc,Env *env)

{
  Expr *pEVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  char *__s;
  RecordField *pRVar5;
  char *pcVar6;
  Type *pTVar7;
  Env *env_00;
  long lVar8;
  string v0;
  string v1;
  string local_d0;
  string local_b0;
  string local_90 [3];
  
  switch(this->expr_type_) {
  case EXPR_ID:
    bVar4 = Env::Evaluated(env,this->id_);
    if (!bVar4) {
      Env::Evaluate(env,out_cc,this->id_);
    }
    __s = Env::RValue(env,this->id_);
    pcVar6 = (char *)(this->str_)._M_string_length;
    strlen(__s);
    goto LAB_0011a803;
  case EXPR_NUM:
    pcVar6 = (char *)(this->str_)._M_string_length;
    __s = (this->num_->s)._M_dataplus._M_p;
    strlen(__s);
LAB_0011a803:
    std::__cxx11::string::_M_replace((ulong)&this->str_,0,pcVar6,(ulong)__s);
    return;
  case EXPR_SUBSCRIPT:
    GenEval(this->operand_[0],out_cc,env);
    GenEval(this->operand_[1],out_cc,env);
    pEVar1 = this->operand_[0];
    GenEval(pEVar1,out_cc,env);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,(pEVar1->str_)._M_dataplus._M_p,(allocator<char> *)&local_b0);
    pEVar1 = this->operand_[1];
    GenEval(pEVar1,out_cc,env);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,(pEVar1->str_)._M_dataplus._M_p,(allocator<char> *)local_90);
    pTVar7 = DataType(this->operand_[0],env);
    if (pTVar7 == (Type *)0x0) {
      strfmt_abi_cxx11_(local_90,"%s[%s]",local_d0._M_dataplus._M_p,local_b0._M_dataplus._M_p);
    }
    else {
      (*(pTVar7->super_DataDepElement)._vptr_DataDepElement[9])(local_90,pTVar7,&local_d0,&local_b0)
      ;
    }
    std::__cxx11::string::operator=((string *)&this->str_,(string *)local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90[0]._M_dataplus._M_p != &local_90[0].field_2) {
      operator_delete(local_90[0]._M_dataplus._M_p,local_90[0].field_2._M_allocated_capacity + 1);
    }
LAB_0011a97b:
    _Var3._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      _Var3._M_p = local_d0._M_dataplus._M_p;
    }
    break;
  case EXPR_MEMBER:
    GenEval(this->operand_[0],out_cc,env);
    pTVar7 = DataType(this->operand_[0],env);
    if (pTVar7 == (Type *)0x0) {
      strfmt_abi_cxx11_(&local_d0,"->%s()",(this->operand_[1]->id_->name)._M_dataplus._M_p);
      pEVar1 = this->operand_[0];
      GenEval(pEVar1,out_cc,env);
      strfmt_abi_cxx11_(&local_b0,"%s%s",(pEVar1->str_)._M_dataplus._M_p,local_d0._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&this->str_,(string *)&local_b0);
      goto LAB_0011a97b;
    }
    pEVar1 = this->operand_[0];
    GenEval(pEVar1,out_cc,env);
    pcVar2 = (pEVar1->str_)._M_dataplus._M_p;
    (*(pTVar7->super_DataDepElement)._vptr_DataDepElement[8])
              (&local_b0,pTVar7,this->operand_[1]->id_);
    strfmt_abi_cxx11_(&local_d0,"%s%s",pcVar2,local_b0._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)&this->str_,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
    goto LAB_0011a9a0;
  case EXPR_CALLARGS:
    EvalExprList_abi_cxx11_(&local_d0,this->args_,out_cc,env);
    std::__cxx11::string::operator=((string *)&this->str_,(string *)&local_d0);
    _Var3._M_p = local_d0._M_dataplus._M_p;
    break;
  case EXPR_SIZEOF:
    pRVar5 = anon_unknown.dwarf_9ab64::GetRecordField(this->operand_[0]->id_,env);
    if (pRVar5 == (RecordField *)0x0) {
      return;
    }
    pcVar6 = RecordField::FieldSize(pRVar5,out_cc,env);
    strfmt_abi_cxx11_(&local_d0,"%s",pcVar6);
    goto LAB_0011a89a;
  case EXPR_OFFSETOF:
    pRVar5 = anon_unknown.dwarf_9ab64::GetRecordField(this->operand_[0]->id_,env);
    pcVar6 = RecordField::FieldOffset(pRVar5,out_cc,env);
    strfmt_abi_cxx11_(&local_d0,"%s",pcVar6);
LAB_0011a89a:
    std::__cxx11::string::operator=((string *)&this->str_,(string *)&local_d0);
    _Var3._M_p = local_d0._M_dataplus._M_p;
    break;
  default:
    if (this->expr_type_ == EXPR_CASE) {
      GenCaseEval(this,out_cc,env);
      return;
    }
  case EXPR_CSTR:
  case EXPR_REGEX:
  case EXPR_PAREN:
  case EXPR_CALL:
    lVar8 = 0xc;
    env_00 = (Env *)out_cc;
    do {
      if (this->operand_[lVar8 + -0xc] != (Expr *)0x0) {
        env_00 = (Env *)out_cc;
        GenEval(this->operand_[lVar8 + -0xc],out_cc,env);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xf);
    GenStrFromFormat(this,env_00);
    return;
  }
  local_b0._M_dataplus._M_p = _Var3._M_p;
  local_b0.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_d0.field_2) {
LAB_0011a9a0:
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Expr::GenEval(Output* out_cc, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_NUM:
			str_ = num_->Str();
			break;

		case EXPR_ID:
			if ( ! env->Evaluated(id_) )
				env->Evaluate(out_cc, id_);
			str_ = env->RValue(id_);
			break;

		case EXPR_MEMBER:
			{
			/*
			For member expressions such X.Y, evaluating
			X only is sufficient. (Actually trying to
			evaluate Y will lead to error because Y is
			not defined in the current environment.)
			*/
			operand_[0]->GenEval(out_cc, env);

			Type* ty0 = operand_[0]->DataType(env);

			if ( ty0 )
				{
				str_ = strfmt("%s%s", operand_[0]->EvalExpr(out_cc, env),
				              ty0->EvalMember(operand_[1]->id()).c_str());
				}
			else
				{
				string tmp = strfmt("->%s()", operand_[1]->id()->Name());
				str_ = strfmt("%s%s", operand_[0]->EvalExpr(out_cc, env), tmp.c_str());
				}
			}
			break;

		case EXPR_SUBSCRIPT:
			{
			operand_[0]->GenEval(out_cc, env);
			operand_[1]->GenEval(out_cc, env);

			string v0 = operand_[0]->EvalExpr(out_cc, env);
			string v1 = operand_[1]->EvalExpr(out_cc, env);

			Type* ty0 = operand_[0]->DataType(env);
			if ( ty0 )
				str_ = ty0->EvalElement(v0, v1);
			else
				str_ = strfmt("%s[%s]", v0.c_str(), v1.c_str());
			}
			break;

		case EXPR_SIZEOF:
			{
			const ID* id = operand_[0]->id();
			RecordField* rf;
			Type* ty;

			try
				{
				if ( (rf = GetRecordField(id, env)) != nullptr )
					{
					str_ = strfmt("%s", rf->FieldSize(out_cc, env));
					}
				}
			catch ( ExceptionIDNotFound& e )
				{
				if ( (ty = TypeDecl::LookUpType(id)) != nullptr )
					{
					int ty_size = ty->StaticSize(global_env());
					if ( ty_size >= 0 )
						str_ = strfmt("%d", ty_size);
					else
						throw Exception(id, "unknown size");
					}
				else
					throw Exception(id, "not a record field or type");
				}
			}
			break;

		case EXPR_OFFSETOF:
			{
			const ID* id = operand_[0]->id();
			RecordField* rf = GetRecordField(id, env);
			str_ = strfmt("%s", rf->FieldOffset(out_cc, env));
			}
			break;

		case EXPR_CALLARGS:
			str_ = EvalExprList(args_, out_cc, env);
			break;

		case EXPR_CASE:
			GenCaseEval(out_cc, env);
			break;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					operand_[i]->GenEval(out_cc, env);
			GenStrFromFormat(env);
			break;
		}
	}